

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cRobustnessTests.cpp
# Opt level: O1

IterateResult __thiscall
gl4cts::RobustnessRobustBufferAccessBehavior::GetnUniformTest::iterate(GetnUniformTest *this)

{
  RenderContext *pRVar1;
  Context *pCVar2;
  _Alloc_hider _Var3;
  GLuint GVar4;
  bool bVar5;
  int iVar6;
  deUint32 dVar7;
  GLint GVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar9;
  pointer __dest;
  undefined4 extraout_var_03;
  char *pcVar10;
  qpTestResult qVar11;
  TestContext *this_00;
  GLuint result4ui [4];
  GLint result3i [3];
  string source;
  GLfloat result4f [4];
  GLint input3i [3];
  GLuint input4ui [4];
  GLfloat input4f [4];
  Program program;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  undefined8 local_118;
  undefined4 local_110;
  string local_108;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  string local_c0;
  Program local_a0;
  undefined4 extraout_var_02;
  
  bVar5 = checkExtension((this->super_TestCase).m_context,"GL_KHR_robustness");
  if ((!bVar5) ||
     (bVar5 = checkExtension((this->super_TestCase).m_context,"GL_KHR_robust_buffer_access_behavior"
                            ), !bVar5)) {
    this_00 = ((this->super_TestCase).m_context)->m_testCtx;
    pcVar10 = "Not Supported";
    qVar11 = QP_TEST_RESULT_NOT_SUPPORTED;
LAB_008de40c:
    tcu::TestContext::setTestResult(this_00,qVar11,pcVar10);
    return STOP;
  }
  pRVar1 = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar6 = (*pRVar1->_vptr_RenderContext[7])(pRVar1,"glGetnUniformfv");
  this->m_pGetnUniformfv = (PFNGLGETNUNIFORMFV)CONCAT44(extraout_var,iVar6);
  pRVar1 = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar6 = (*pRVar1->_vptr_RenderContext[7])(pRVar1,"glGetnUniformiv");
  this->m_pGetnUniformiv = (PFNGLGETNUNIFORMIV)CONCAT44(extraout_var_00,iVar6);
  pRVar1 = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar6 = (*pRVar1->_vptr_RenderContext[7])(pRVar1,"glGetnUniformuiv");
  this->m_pGetnUniformuiv = (PFNGLGETNUNIFORMUIV)CONCAT44(extraout_var_01,iVar6);
  pCVar2 = (this->super_TestCase).m_context;
  if ((((PFNGLGETNUNIFORMUIV)CONCAT44(extraout_var_01,iVar6) == (PFNGLGETNUNIFORMUIV)0x0) ||
      (this->m_pGetnUniformfv == (PFNGLGETNUNIFORMFV)0x0)) ||
     (this->m_pGetnUniformiv == (PFNGLGETNUNIFORMIV)0x0)) {
    this_00 = pCVar2->m_testCtx;
    pcVar10 = "Pointer to function glGetnUniform* is NULL.";
    qVar11 = QP_TEST_RESULT_INTERNAL_ERROR;
    goto LAB_008de40c;
  }
  iVar6 = (*pCVar2->m_renderCtx->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var_02,iVar6);
  local_d8 = 0x40accccd3f800000;
  uStack_d0 = 0x3fa3d70a40490fd0;
  local_118 = 0xffffffec0000000a;
  local_110 = 0xffffffe2;
  local_e8 = 0x140000000a;
  uStack_e0 = 0x280000001e;
  local_a0.m_compute.m_context = (this->super_TestCase).m_context;
  local_a0.m_id = 0;
  local_a0.m_compute.m_id = 0;
  local_a0.m_fragment.m_id = 0;
  local_a0.m_geometry.m_id = 0;
  local_a0.m_tess_ctrl.m_id = 0;
  local_a0.m_tess_eval.m_id = 0;
  local_a0.m_vertex.m_id = 0;
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  local_138._M_dataplus._M_p = (pointer)0x1c3;
  local_a0.m_fragment.m_context = local_a0.m_compute.m_context;
  local_a0.m_geometry.m_context = local_a0.m_compute.m_context;
  local_a0.m_tess_ctrl.m_context = local_a0.m_compute.m_context;
  local_a0.m_tess_eval.m_context = local_a0.m_compute.m_context;
  local_a0.m_vertex.m_context = local_a0.m_compute.m_context;
  local_a0.m_context = local_a0.m_compute.m_context;
  __dest = (pointer)std::__cxx11::string::_M_create((ulong *)&local_158,(ulong)&local_138);
  _Var3._M_p = local_138._M_dataplus._M_p;
  local_158.field_2._M_allocated_capacity = (size_type)local_138._M_dataplus._M_p;
  local_158._M_dataplus._M_p = __dest;
  memcpy(__dest,
         "#version 320 es\n\nlayout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n\nlayout (location = 11) uniform vec4 inputf;\nlayout (location = 12) uniform ivec3 inputi;\nlayout (location = 13) uniform uvec4 inputu;\n\nshared float valuef;\nshared int valuei;\nshared uint valueu;\n\nvoid main()\n{\n   valuef = inputf.r + inputf.g + inputf.b + inputf.a;\n   valuei = inputi.r + inputi.g + inputi.b;\n   valueu = inputu.r + inputu.g + inputu.b + inputu.a;\n}\n\n"
         ,0x1c3);
  local_158._M_string_length = (size_type)_Var3._M_p;
  __dest[_Var3._M_p] = '\0';
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,0x1b3c1e9);
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,0x1b3c1e9);
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,0x1b3c1e9);
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,0x1b3c1e9);
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,0x1b3c1e9);
  RobustnessRobustBufferAccessBehavior::Program::Init
            (&local_a0,&local_158,&local_138,&local_198,&local_178,&local_108,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  iVar6 = (*(local_a0.m_context)->m_renderCtx->_vptr_RenderContext[3])();
  GVar4 = local_a0.m_id;
  (**(code **)(CONCAT44(extraout_var_03,iVar6) + 0x1680))(local_a0.m_id);
  dVar7 = (**(code **)(CONCAT44(extraout_var_03,iVar6) + 0x800))();
  glu::checkError(dVar7,"UseProgram",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cRobustnessTests.cpp"
                  ,0x280);
  (**(code **)(lVar9 + 0x1138))(GVar4,0xb,1,&local_d8);
  dVar7 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar7,"ProgramUniform4fv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cRobustnessTests.cpp"
                  ,0x4d7);
  (**(code **)(lVar9 + 0x1108))(GVar4,0xc,1,&local_118);
  dVar7 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar7,"ProgramUniform3iv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cRobustnessTests.cpp"
                  ,0x4da);
  (**(code **)(lVar9 + 0x1158))(GVar4,0xd,1,&local_e8);
  dVar7 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar7,"ProgramUniform4uiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cRobustnessTests.cpp"
                  ,0x4dd);
  (**(code **)(lVar9 + 0x528))(1,1,1);
  dVar7 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar7,"DispatchCompute",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cRobustnessTests.cpp"
                  ,0x4e0);
  (*this->m_pGetnUniformfv)(GVar4,0xb,0x10,(GLfloat *)&local_138);
  bVar5 = verifyResult(this,&local_d8,&local_138,0x10,"getnUniformfv [false negative]");
  if (bVar5) {
    GVar8 = (**(code **)(lVar9 + 0x800))();
    bVar5 = verifyError(this,GVar8,0,"getnUniformfv [false negative]");
  }
  else {
    bVar5 = false;
  }
  (*this->m_pGetnUniformfv)(GVar4,0xb,0xc,(GLfloat *)&local_138);
  if (bVar5 == false) {
    bVar5 = false;
  }
  else {
    GVar8 = (**(code **)(lVar9 + 0x800))();
    bVar5 = verifyError(this,GVar8,0x502,"getnUniformfv [false positive]");
  }
  (*this->m_pGetnUniformiv)(GVar4,0xc,0xc,(GLint *)&local_178);
  if ((bVar5 == false) ||
     (bVar5 = verifyResult(this,&local_118,&local_178,0xc,"getnUniformiv [false negative]"), !bVar5)
     ) {
    bVar5 = false;
  }
  else {
    GVar8 = (**(code **)(lVar9 + 0x800))();
    bVar5 = verifyError(this,GVar8,0,"getnUniformiv [false negative]");
  }
  (*this->m_pGetnUniformiv)(GVar4,0xc,8,(GLint *)&local_178);
  if (bVar5 == false) {
    bVar5 = false;
  }
  else {
    GVar8 = (**(code **)(lVar9 + 0x800))();
    bVar5 = verifyError(this,GVar8,0x502,"getnUniformiv [false positive]");
  }
  (*this->m_pGetnUniformuiv)(GVar4,0xd,0x10,(GLuint *)&local_198);
  if ((bVar5 == false) ||
     (bVar5 = verifyResult(this,&local_e8,&local_198,0x10,"getnUniformuiv [false negative]"), !bVar5
     )) {
    bVar5 = false;
  }
  else {
    GVar8 = (**(code **)(lVar9 + 0x800))();
    bVar5 = verifyError(this,GVar8,0,"getnUniformuiv [false negative]");
  }
  (*this->m_pGetnUniformuiv)(GVar4,0xd,0xc,(GLuint *)&local_198);
  if (bVar5 != false) {
    GVar8 = (**(code **)(lVar9 + 0x800))();
    bVar5 = verifyError(this,GVar8,0x502,"getnUniformuiv [false positive]");
    if (bVar5) {
      pcVar10 = "Pass";
      qVar11 = QP_TEST_RESULT_PASS;
      goto LAB_008de5d2;
    }
  }
  pcVar10 = "Fail";
  qVar11 = QP_TEST_RESULT_FAIL;
LAB_008de5d2:
  tcu::TestContext::setTestResult(((this->super_TestCase).m_context)->m_testCtx,qVar11,pcVar10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,(ulong)(local_158.field_2._M_allocated_capacity + 1))
    ;
  }
  RobustnessRobustBufferAccessBehavior::Program::~Program(&local_a0);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GetnUniformTest::iterate()
{
	if (!checkExtension(m_context, "GL_KHR_robustness") ||
		!checkExtension(m_context, "GL_KHR_robust_buffer_access_behavior"))
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");
		return STOP;
	}

	m_pGetnUniformfv  = (PFNGLGETNUNIFORMFV)m_context.getRenderContext().getProcAddress("glGetnUniformfv");
	m_pGetnUniformiv  = (PFNGLGETNUNIFORMIV)m_context.getRenderContext().getProcAddress("glGetnUniformiv");
	m_pGetnUniformuiv = (PFNGLGETNUNIFORMUIV)m_context.getRenderContext().getProcAddress("glGetnUniformuiv");

	if ((DE_NULL == m_pGetnUniformfv) || (DE_NULL == m_pGetnUniformiv) || (DE_NULL == m_pGetnUniformuiv))
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_INTERNAL_ERROR,
												 "Pointer to function glGetnUniform* is NULL.");
		return STOP;
	}

	const Functions& gl = m_context.getRenderContext().getFunctions();

	const GLfloat input4f[]  = { 1.0f, 5.4f, 3.14159f, 1.28f };
	const GLint   input3i[]  = { 10, -20, -30 };
	const GLuint  input4ui[] = { 10, 20, 30, 40 };

	/* Test result indicator */
	bool test_result = true;

	/* Iterate over all cases */
	Program program(m_context);

	/* Compute Shader */
	const std::string& cs = getComputeShader();

	/* Shaders initialization */
	program.Init(cs /* cs */, "" /* fs */, "" /* gs */, "" /* tcs */, "" /* tes */, "" /* vs */);
	program.Use();

	/* passing uniform values */
	gl.programUniform4fv(program.m_id, 11, 1, input4f);
	GLU_EXPECT_NO_ERROR(gl.getError(), "ProgramUniform4fv");

	gl.programUniform3iv(program.m_id, 12, 1, input3i);
	GLU_EXPECT_NO_ERROR(gl.getError(), "ProgramUniform3iv");

	gl.programUniform4uiv(program.m_id, 13, 1, input4ui);
	GLU_EXPECT_NO_ERROR(gl.getError(), "ProgramUniform4uiv");

	gl.dispatchCompute(1, 1, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DispatchCompute");

	/* veryfing gfetnUniform error messages */
	GLfloat result4f[4];
	GLint   result3i[3];
	GLuint  result4ui[4];

	m_pGetnUniformfv(program.m_id, 11, sizeof(GLfloat) * 4, result4f);
	test_result = test_result &&
				  verifyResult((void*)input4f, (void*)result4f, sizeof(GLfloat) * 4, "getnUniformfv [false negative]");
	test_result = test_result && verifyError(gl.getError(), GL_NO_ERROR, "getnUniformfv [false negative]");

	m_pGetnUniformfv(program.m_id, 11, sizeof(GLfloat) * 3, result4f);
	test_result = test_result && verifyError(gl.getError(), GL_INVALID_OPERATION, "getnUniformfv [false positive]");

	m_pGetnUniformiv(program.m_id, 12, sizeof(GLint) * 3, result3i);
	test_result = test_result &&
				  verifyResult((void*)input3i, (void*)result3i, sizeof(GLint) * 3, "getnUniformiv [false negative]");
	test_result = test_result && verifyError(gl.getError(), GL_NO_ERROR, "getnUniformiv [false negative]");

	m_pGetnUniformiv(program.m_id, 12, sizeof(GLint) * 2, result3i);
	test_result = test_result && verifyError(gl.getError(), GL_INVALID_OPERATION, "getnUniformiv [false positive]");

	m_pGetnUniformuiv(program.m_id, 13, sizeof(GLuint) * 4, result4ui);
	test_result = test_result && verifyResult((void*)input4ui, (void*)result4ui, sizeof(GLuint) * 4,
											  "getnUniformuiv [false negative]");
	test_result = test_result && verifyError(gl.getError(), GL_NO_ERROR, "getnUniformuiv [false negative]");

	m_pGetnUniformuiv(program.m_id, 13, sizeof(GLuint) * 3, result4ui);
	test_result = test_result && verifyError(gl.getError(), GL_INVALID_OPERATION, "getnUniformuiv [false positive]");

	/* Set result */
	if (true == test_result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return tcu::TestNode::STOP;
}